

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

void __thiscall
re2::TestInstance::RunSearch
          (TestInstance *this,Engine type,StringPiece *orig_text,StringPiece *orig_context,
          Anchor anchor,Result *result)

{
  int iVar1;
  bool bVar2;
  Arg **args;
  Arg *pAVar3;
  StringPiece *pSVar4;
  ostream *poVar5;
  Arg *pAVar6;
  StringPiece *src;
  StringPiece *src_00;
  Anchor anchor_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  Anchor re_anchor;
  uint n;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  StringPiece text;
  StringPiece context;
  int consumed;
  StringPiece local_218;
  StringPiece local_208;
  long local_1f8;
  string local_1f0;
  string local_1d0;
  LogMessage local_1b0;
  int iVar10;
  
  memset(result,0,0x118);
  if (this->regexp_ == (Regexp *)0x0) {
    result->skipped = true;
    return;
  }
  iVar1 = this->num_captures_;
  iVar10 = 0x10;
  if (iVar1 < 0x10) {
    iVar10 = iVar1;
  }
  n = iVar10 + 1;
  local_218.ptr_ = orig_text->ptr_;
  local_218.length_ = orig_text->length_;
  local_218._12_4_ = *(undefined4 *)&orig_text->field_0xc;
  local_208.ptr_ = orig_context->ptr_;
  local_208.length_ = orig_context->length_;
  local_208._12_4_ = *(undefined4 *)&orig_context->field_0xc;
  switch(type) {
  case kEngineBacktrack:
    goto switchD_0011e13f_caseD_0;
  case kEngineNFA:
    if (this->prog_ == (Prog *)0x0) break;
    bVar2 = Prog::SearchNFA(this->prog_,&local_218,&local_208,anchor,this->kind_,result->submatch,n)
    ;
    goto LAB_0011e5f5;
  case kEngineDFA:
    if (this->prog_ != (Prog *)0x0) {
      bVar2 = Prog::SearchDFA(this->prog_,&local_218,&local_208,anchor,this->kind_,
                              (StringPiece *)0x0,&result->skipped,
                              (vector<int,_std::allocator<int>_> *)0x0);
      result->matched = bVar2;
      goto LAB_0011e601;
    }
    break;
  case kEngineDFA1:
    if ((this->prog_ != (Prog *)0x0) && (this->rprog_ != (Prog *)0x0)) {
      pSVar4 = result->submatch;
      bVar2 = Prog::SearchDFA(this->prog_,&local_218,&local_208,anchor,this->kind_,pSVar4,
                              &result->skipped,(vector<int,_std::allocator<int>_> *)0x0);
      result->matched = bVar2;
      if ((bVar2) &&
         (bVar2 = Prog::SearchDFA(this->rprog_,pSVar4,&local_208,kAnchored,kLongestMatch,pSVar4,
                                  &result->skipped,(vector<int,_std::allocator<int>_> *)0x0), !bVar2
         )) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x15c,2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"Reverse DFA inconsistency: ",0x1b);
        CEscape_abi_cxx11_(&local_1d0,(re2 *)this->regexp_str_,src);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0.str_,local_1d0._M_dataplus._M_p,
                            local_1d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," on ",4);
        CEscape_abi_cxx11_(&local_1f0,(re2 *)&local_218,src_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        LogMessage::~LogMessage(&local_1b0);
        result->matched = false;
      }
      result->have_submatch0 = true;
      goto LAB_0011e601;
    }
    break;
  case kEngineOnePass:
    if ((anchor != kUnanchored && this->prog_ != (Prog *)0x0) &&
       (bVar2 = Prog::IsOnePass(this->prog_), bVar2 && iVar1 < 5)) {
      bVar2 = Prog::SearchOnePass(this->prog_,&local_218,&local_208,anchor,this->kind_,
                                  result->submatch,n);
      goto LAB_0011e5f5;
    }
    break;
  case kEngineBitState:
    if (this->prog_ != (Prog *)0x0) {
      bVar2 = Prog::SearchBitState
                        (this->prog_,&local_218,&local_208,anchor,this->kind_,result->submatch,n);
      goto LAB_0011e5f5;
    }
    break;
  case kEngineRE2:
  case kEngineRE2a:
  case kEngineRE2b:
    if ((this->re2_ != (RE2 *)0x0) &&
       (local_218.ptr_ + local_218.length_ == local_208.ptr_ + local_208.length_)) {
      re_anchor = (Anchor)(anchor == kAnchored);
      if (this->kind_ == kFullMatch) {
        re_anchor = ANCHOR_BOTH;
      }
      bVar2 = RE2::Match(this->re2_,&local_208,(int)local_218.ptr_ - (int)local_208.ptr_,
                         (int)(local_218.ptr_ + local_218.length_) - (int)local_208.ptr_,re_anchor,
                         result->submatch,n);
      result->matched = bVar2;
      result->have_submatch = -1 < iVar1;
      goto LAB_0011e601;
    }
    break;
  case kEnginePCRE:
    if ((((this->re_ != (PCRE *)0x0) && (local_218.ptr_ == local_208.ptr_)) &&
        (local_218.ptr_ + local_218.length_ == local_208.ptr_ + local_208.length_)) &&
       (((s._8_8_ = 2, s.ptr_ = "\\s", bVar2 = StringPiece::contains(this->regexp_str_,s), !bVar2 &&
         (s_00._8_8_ = 2, s_00.ptr_ = "\\S", bVar2 = StringPiece::contains(this->regexp_str_,s_00),
         !bVar2)) ||
        (s_01._8_8_ = 1, s_01.ptr_ = "\v", bVar2 = StringPiece::contains(&local_218,s_01), !bVar2)))
       ) {
      lVar7 = (long)(int)n;
      uVar9 = lVar7 * 8;
      uVar8 = lVar7 * 0x10;
      if (iVar1 < -1) {
        uVar9 = 0xffffffffffffffff;
        uVar8 = 0xffffffffffffffff;
      }
      local_1f8 = lVar7;
      args = (Arg **)operator_new__(uVar9);
      pAVar3 = (Arg *)operator_new__(uVar8);
      if ((int)local_1f8 != 0) {
        pAVar6 = pAVar3;
        do {
          pAVar6->arg_ = (void *)0x0;
          pAVar6->parser_ = PCRE::Arg::parse_null;
          pAVar6 = pAVar6 + 1;
        } while (pAVar6 != pAVar3 + lVar7);
      }
      if (-1 < iVar1) {
        pSVar4 = result->submatch;
        uVar9 = 0;
        pAVar6 = pAVar3;
        do {
          pAVar6->arg_ = pSVar4;
          pAVar6->parser_ = PCRE::Arg::parse_stringpiece;
          args[uVar9] = pAVar6;
          uVar9 = uVar9 + 1;
          pAVar6 = pAVar6 + 1;
          pSVar4 = pSVar4 + 1;
        } while (n != uVar9);
      }
      anchor_00 = (Anchor)(anchor == kAnchored);
      if (this->kind_ == kFullMatch) {
        anchor_00 = ANCHOR_BOTH;
      }
      PCRE::ClearHitLimit(this->re_);
      bVar2 = PCRE::DoMatch(this->re_,&local_218,anchor_00,&local_1b0.severity_,args,n);
      result->matched = bVar2;
      bVar2 = PCRE::HitLimit(this->re_);
      if (bVar2) {
        result->untrusted = true;
      }
      else {
        result->have_submatch = true;
        if (-1 < iVar1) {
          lVar7 = 0;
          do {
            if (*(char **)((long)&result->submatch[0].ptr_ + lVar7) == local_218.ptr_ + -1) {
              *(undefined8 *)((long)&result->submatch[0].ptr_ + lVar7) = 0;
              *(undefined4 *)((long)&result->submatch[0].length_ + lVar7) = 0;
            }
            lVar7 = lVar7 + 0x10;
          } while ((ulong)n << 4 != lVar7);
        }
      }
      operator_delete__(args);
      operator_delete__(pAVar3);
      goto LAB_0011e601;
    }
    break;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,300,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Bad RunSearch type: ",0x14);
    std::ostream::operator<<((ostream *)&local_1b0.str_,type);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
switchD_0011e13f_caseD_0:
    if (this->prog_ != (Prog *)0x0) {
      bVar2 = Prog::UnsafeSearchBacktrack
                        (this->prog_,&local_218,&local_208,anchor,this->kind_,result->submatch,n);
LAB_0011e5f5:
      result->matched = bVar2;
      result->have_submatch = true;
      goto LAB_0011e601;
    }
  }
  result->skipped = true;
LAB_0011e601:
  if (result->matched == false) {
    memset(result->submatch,0,0x110);
  }
  return;
}

Assistant:

void TestInstance::RunSearch(Engine type,
                             const StringPiece& orig_text,
                             const StringPiece& orig_context,
                             Prog::Anchor anchor,
                             Result *result) {
  memset(result, 0, sizeof *result);
  if (regexp_ == NULL) {
    result->skipped = true;
    return;
  }
  int nsubmatch = 1 + num_captures_;  // NumCaptures doesn't count $0
  if (nsubmatch > kMaxSubmatch)
    nsubmatch = kMaxSubmatch;

  StringPiece text = orig_text;
  StringPiece context = orig_context;

  switch (type) {
    default:
      LOG(FATAL) << "Bad RunSearch type: " << (int)type;

    case kEngineBacktrack:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->UnsafeSearchBacktrack(text, context, anchor, kind_,
                                     result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineNFA:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->SearchNFA(text, context, anchor, kind_,
                        result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineDFA:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchDFA(text, context, anchor, kind_, NULL,
                                         &result->skipped, NULL);
      break;

    case kEngineDFA1:
      if (prog_ == NULL || rprog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->SearchDFA(text, context, anchor, kind_, result->submatch,
                         &result->skipped, NULL);
      // If anchored, no need for second run,
      // but do it anyway to find more bugs.
      if (result->matched) {
        if (!rprog_->SearchDFA(result->submatch[0], context,
                               Prog::kAnchored, Prog::kLongestMatch,
                               result->submatch,
                               &result->skipped, NULL)) {
          LOG(ERROR) << "Reverse DFA inconsistency: "
                     << CEscape(regexp_str_)
                     << " on " << CEscape(text);
          result->matched = false;
        }
      }
      result->have_submatch0 = true;
      break;

    case kEngineOnePass:
      if (prog_ == NULL ||
          anchor == Prog::kUnanchored ||
          !prog_->IsOnePass() ||
          nsubmatch > Prog::kMaxOnePassCapture) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchOnePass(text, context, anchor, kind_,
                                      result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineBitState:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchBitState(text, context, anchor, kind_,
                                              result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineRE2:
    case kEngineRE2a:
    case kEngineRE2b: {
      if (!re2_ || text.end() != context.end()) {
        result->skipped = true;
        break;
      }

      RE2::Anchor re_anchor;
      if (anchor == Prog::kAnchored)
        re_anchor = RE2::ANCHOR_START;
      else
        re_anchor = RE2::UNANCHORED;
      if (kind_ == Prog::kFullMatch)
        re_anchor = RE2::ANCHOR_BOTH;

      result->matched = re2_->Match(
          context,
          static_cast<int>(text.begin() - context.begin()),
          static_cast<int>(text.end() - context.begin()),
          re_anchor,
          result->submatch,
          nsubmatch);
      result->have_submatch = nsubmatch > 0;
      break;
    }

    case kEnginePCRE: {
      if (!re_ || text.begin() != context.begin() ||
          text.end() != context.end()) {
        result->skipped = true;
        break;
      }

      // PCRE 8.34 or so started allowing vertical tab to match \s,
      // following a change made in Perl 5.18. RE2 does not.
      if ((regexp_str_.contains("\\s") || regexp_str_.contains("\\S")) &&
          text.contains("\v")) {
        result->skipped = true;
        break;
      }

      const PCRE::Arg **argptr = new const PCRE::Arg*[nsubmatch];
      PCRE::Arg *a = new PCRE::Arg[nsubmatch];
      for (int i = 0; i < nsubmatch; i++) {
        a[i] = PCRE::Arg(&result->submatch[i]);
        argptr[i] = &a[i];
      }
      int consumed;
      PCRE::Anchor pcre_anchor;
      if (anchor == Prog::kAnchored)
        pcre_anchor = PCRE::ANCHOR_START;
      else
        pcre_anchor = PCRE::UNANCHORED;
      if (kind_ == Prog::kFullMatch)
        pcre_anchor = PCRE::ANCHOR_BOTH;
      re_->ClearHitLimit();
      result->matched =
        re_->DoMatch(text,
                     pcre_anchor,
                     &consumed,
                     argptr, nsubmatch);
      if (re_->HitLimit()) {
        result->untrusted = true;
        delete[] argptr;
        delete[] a;
        break;
      }
      result->have_submatch = true;

      // Work around RE interface bug: PCRE returns -1 as the
      // offsets for an unmatched subexpression, and RE should
      // turn that into StringPiece(NULL) but in fact it uses
      // StringPiece(text.begin() - 1, 0).  Oops.
      for (int i = 0; i < nsubmatch; i++)
        if (result->submatch[i].begin() == text.begin() - 1)
          result->submatch[i] = NULL;
      delete[] argptr;
      delete[] a;
      break;
    }
  }

  if (!result->matched)
    memset(result->submatch, 0, sizeof result->submatch);
}